

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

FState * __thiscall
FStateLabelStorage::GetState(FStateLabelStorage *this,int pos,PClassActor *cls,bool exact)

{
  int numnames;
  uchar *puVar1;
  FState *pFVar2;
  uint uVar3;
  FState *pFVar4;
  bool bVar5;
  FName local_4;
  
  if (0x10000000 < pos) {
    if (cls == (PClassActor *)0x0) {
      return (FState *)0x0;
    }
    pFVar4 = PClassActor::FindState(cls,1,&local_4,false);
    return pFVar4;
  }
  if (pos < 0) {
    uVar3 = (uint)pos >> 0x10 & 0x7fff;
    pFVar4 = *(FState **)((this->Storage).Array + ((ulong)(uint)pos & 0xffff) * 4);
    if ((PClassActor *)AActor::RegistrationInfo.MyClass != cls) {
      do {
        pFVar2 = cls->OwnedStates;
        if ((pFVar2 <= pFVar4) && (pFVar4 < pFVar2 + cls->NumOwnedStates)) {
          bVar5 = pFVar4 + uVar3 < pFVar2 + cls->NumOwnedStates && pFVar2 <= pFVar4 + uVar3;
          goto LAB_004564b7;
        }
        cls = (PClassActor *)(cls->super_PClass).ParentClass;
      } while (cls != (PClassActor *)AActor::RegistrationInfo.MyClass);
    }
    bVar5 = false;
LAB_004564b7:
    if (bVar5) {
      return pFVar4 + uVar3;
    }
    return (FState *)0x0;
  }
  if (pos == 0) {
    return (FState *)0x0;
  }
  pFVar4 = (FState *)(ulong)(pos * 4 - 4);
  puVar1 = (this->Storage).Array;
  numnames = *(int *)((long)&pFVar4->NextState + (long)puVar1);
  if (numnames == 0) {
    pFVar4 = *(FState **)((long)&pFVar4->NextState + (long)(puVar1 + 4));
  }
  else {
    if (cls == (PClassActor *)0x0) {
      bVar5 = true;
      goto LAB_004564cd;
    }
    pFVar4 = PClassActor::FindState
                       (cls,numnames,(FName *)((long)&pFVar4->NextState + (long)(puVar1 + 4)),exact)
    ;
  }
  bVar5 = false;
LAB_004564cd:
  if (bVar5) {
    return (FState *)0x0;
  }
  return pFVar4;
}

Assistant:

FState *FStateLabelStorage::GetState(int pos, PClassActor *cls, bool exact)
{
	if (pos > 0x10000000)
	{
		return cls? cls->FindState(ENamedName(pos - 0x10000000)) : nullptr;
	}
	else if (pos < 0)
	{
		// decode the combined value produced by the script.
		int index = (pos >> 16) & 32767;
		pos = ((pos & 65535) - 1) * 4;
		FState *state;
		memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
		if (VerifyJumpTarget(cls, state, index))
			return state + index;
		else
			return nullptr;
	}
	else if (pos > 0)
	{
		int val;
		pos = (pos - 1) * 4;
		memcpy(&val, &Storage[pos], sizeof(int));

		if (val == 0)
		{
			FState *state;
			memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
			return state;
		}
		else if (cls != nullptr)
		{
			FName *labels = (FName*)&Storage[pos + sizeof(int)];
			return cls->FindState(val, labels, exact);
		}
	}
	return nullptr;
}